

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ONX_ErrorCounter * __thiscall
ONX_ErrorCounter::operator+(ONX_ErrorCounter *this,ONX_ErrorCounter *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ONX_ErrorCounter *in_RDI;
  uint uVar5;
  uint uVar6;
  
  uVar1 = this->m_error_count;
  uVar2 = this->m_warning_count;
  uVar5 = this->m_state_bit_field;
  uVar6 = rhs->m_error_count;
  uVar3 = rhs->m_warning_count;
  uVar4 = rhs->m_state_bit_field;
  in_RDI->m_failure_count = rhs->m_failure_count + this->m_failure_count;
  in_RDI->m_error_count = uVar6 + uVar1;
  in_RDI->m_warning_count = uVar3 + uVar2;
  in_RDI->m_state_bit_field = uVar4 | uVar5;
  uVar1 = this->m_opennurbs_library_warning_count;
  uVar2 = rhs->m_opennurbs_library_warning_count;
  uVar5 = -(uint)((int)(rhs->m_opennurbs_library_error_count ^ 0x80000000) <
                 (int)(this->m_opennurbs_library_error_count ^ 0x80000000));
  uVar6 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)(uVar1 ^ 0x80000000));
  in_RDI->m_opennurbs_library_error_count =
       ~uVar5 & rhs->m_opennurbs_library_error_count | this->m_opennurbs_library_error_count & uVar5
  ;
  in_RDI->m_opennurbs_library_warning_count = ~uVar6 & uVar2 | uVar1 & uVar6;
  return in_RDI;
}

Assistant:

const ONX_ErrorCounter ONX_ErrorCounter::operator+ (
  const ONX_ErrorCounter& rhs
  )
{
  ONX_ErrorCounter sum;
  sum.m_failure_count = m_failure_count + rhs.m_failure_count;
  sum.m_error_count = m_error_count + rhs.m_error_count;
  sum.m_warning_count = m_warning_count + rhs.m_warning_count;


  sum.m_state_bit_field = m_state_bit_field | rhs.m_state_bit_field;
  sum.m_opennurbs_library_error_count
    = (m_opennurbs_library_error_count < rhs.m_opennurbs_library_error_count)
    ? rhs.m_opennurbs_library_error_count
    : m_opennurbs_library_error_count;
  sum.m_opennurbs_library_warning_count
    = (m_opennurbs_library_warning_count < rhs.m_opennurbs_library_warning_count)
    ? rhs.m_opennurbs_library_warning_count
    : m_opennurbs_library_warning_count;

  return sum;
}